

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

bool __thiscall S1Interval::Contains(S1Interval *this,double p)

{
  bool bVar1;
  S2LogMessage SStack_18;
  
  if (ABS(p) <= 3.141592653589793) {
    bVar1 = FastContains(this,(double)(~-(ulong)(p == -3.141592653589793) & (ulong)p |
                                      -(ulong)(p == -3.141592653589793) & 0x400921fb54442d18));
    return bVar1;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
             ,0x48,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ");
  abort();
}

Assistant:

bool S1Interval::Contains(double p) const {
  // Works for empty, full, and singleton intervals.
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;
  return FastContains(p);
}